

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void quternionToCnbMatrix(double q0,double q1,double q2,double q3)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pdVar1 = (double *)malloc(0x48);
  dVar2 = q2 * q2;
  dVar3 = q3 * q3;
  mahonyR = pdVar1;
  *pdVar1 = ((q0 * q0 + q1 * q1) - dVar2) - dVar3;
  dVar5 = q2 * q1 - q3 * q0;
  pdVar1[1] = dVar5 + dVar5;
  dVar5 = q3 * q1 + q2 * q0;
  dVar4 = q3 * q0 + q2 * q1;
  pdVar1[2] = dVar5 + dVar5;
  pdVar1[3] = dVar4 + dVar4;
  dVar5 = q0 * q0 - q1 * q1;
  pdVar1[4] = (dVar5 + dVar2) - dVar3;
  dVar4 = q2 * q3 + q0 * q1;
  dVar6 = q2 * q3 - q0 * q1;
  dVar7 = q3 * q1 - q2 * q0;
  pdVar1[5] = dVar6 + dVar6;
  pdVar1[6] = dVar7 + dVar7;
  pdVar1[7] = dVar4 + dVar4;
  pdVar1[8] = (dVar5 - dVar2) + dVar3;
  return;
}

Assistant:

void quternionToCnbMatrix(double q0, double q1, double q2, double q3) {
    mahonyR = (double *) malloc(sizeof(double) * 9);

    double q0q0 = q0 * q0;
    double q1q1 = q1 * q1;
    double q2q2 = q2 * q2;
    double q3q3 = q3 * q3;
    double q0q1 = q0 * q1;
    double q0q2 = q0 * q2;
    double q0q3 = q0 * q3;
    double q1q2 = q1 * q2;
    double q1q3 = q1 * q3;
    double q2q3 = q2 * q3;
    //定义Cnb
    mahonyR[0] = q0q0 + q1q1 - q2q2 - q3q3;
    mahonyR[1] = 2 * (q1q2 - q0q3);
    mahonyR[2] = 2 * (q1q3 + q0q2);
    mahonyR[3] = 2 * (q1q2 + q0q3);
    mahonyR[4] = q0q0 - q1q1 + q2q2 - q3q3;
    mahonyR[5] = 2 * (q2q3 - q0q1);
    mahonyR[6] = 2 * (q1q3 - q0q2);
    mahonyR[7] = 2 * (q2q3 + q0q1);
    mahonyR[8] = q0q0 - q1q1 - q2q2 + q3q3;
}